

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_model.hpp
# Opt level: O0

bool __thiscall
BaseModel::detectChessboardCorners
          (BaseModel *this,Mat *image,Size *board_size,
          vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *image_points,
          bool draw_corners)

{
  byte bVar1;
  int iVar2;
  undefined7 in_register_00000081;
  Mat local_1f0;
  _InputArray local_190;
  Size_<int> local_178;
  _InputOutputArray local_170;
  TermCriteria local_158;
  Size_<int> local_148;
  Size_<int> local_140;
  _InputOutputArray local_138;
  _InputArray local_120;
  _InputArray local_108;
  _InputArray local_f0;
  undefined1 local_d8 [8];
  Mat gray;
  Size_<int> local_50;
  _InputArray local_48;
  byte local_2a;
  byte local_29;
  bool found;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *pvStack_28;
  bool draw_corners_local;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *image_points_local;
  Size *board_size_local;
  Mat *image_local;
  BaseModel *this_local;
  
  iVar2 = (int)CONCAT71(in_register_00000081,draw_corners);
  local_29 = draw_corners;
  pvStack_28 = image_points;
  image_points_local = (vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> *)board_size;
  board_size_local = (Size *)image;
  image_local = (Mat *)this;
  cv::_InputArray::_InputArray(&local_48,image);
  cv::Size_<int>::Size_(&local_50,(Size_<int> *)image_points_local);
  cv::_OutputArray::_OutputArray<cv::Point_<float>>((_OutputArray *)(gray.step.buf + 1),pvStack_28);
  bVar1 = cv::findChessboardCorners(&local_48,&local_50,gray.step.buf + 1);
  cv::_OutputArray::~_OutputArray((_OutputArray *)(gray.step.buf + 1));
  cv::_InputArray::~_InputArray(&local_48);
  local_2a = bVar1 & 1;
  if (local_2a != 0) {
    cv::Mat::Mat((Mat *)local_d8);
    cv::_InputArray::_InputArray(&local_f0,(Mat *)board_size_local);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_108,(Mat *)local_d8);
    cv::cvtColor((cv *)&local_f0,&local_108,(_OutputArray *)0x6,0,iVar2);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_108);
    cv::_InputArray::~_InputArray(&local_f0);
    cv::_InputArray::_InputArray(&local_120,(Mat *)local_d8);
    cv::_InputOutputArray::_InputOutputArray<cv::Point_<float>>(&local_138,pvStack_28);
    cv::Size_<int>::Size_(&local_140,0xb,0xb);
    cv::Size_<int>::Size_(&local_148,-1,-1);
    cv::TermCriteria::TermCriteria(&local_158,3,0x1e,0.1);
    cv::cornerSubPix(local_158.epsilon,&local_120,&local_138,&local_140,&local_148,local_158._0_8_);
    cv::_InputOutputArray::~_InputOutputArray(&local_138);
    cv::_InputArray::~_InputArray(&local_120);
    if ((local_29 & 1) != 0) {
      cv::_InputOutputArray::_InputOutputArray(&local_170,(Mat *)board_size_local);
      cv::Size_<int>::Size_(&local_178,(Size_<int> *)image_points_local);
      cv::Mat::Mat<cv::Point_<float>>(&local_1f0,pvStack_28,false);
      cv::_InputArray::_InputArray(&local_190,&local_1f0);
      cv::drawChessboardCorners(&local_170,&local_178,&local_190,local_2a & 1);
      cv::_InputArray::~_InputArray(&local_190);
      cv::Mat::~Mat(&local_1f0);
      cv::_InputOutputArray::~_InputOutputArray(&local_170);
    }
    cv::Mat::~Mat((Mat *)local_d8);
  }
  return (bool)(local_2a & 1);
}

Assistant:

bool detectChessboardCorners(
    cv::Mat& image,
    const cv::Size& board_size,
    std::vector<cv::Point2f>& image_points,
    bool draw_corners=true
  ) {
    bool found = cv::findChessboardCorners(
      image,
      board_size,
      image_points,
      cv::CALIB_CB_ADAPTIVE_THRESH | cv::CALIB_CB_NORMALIZE_IMAGE
    );

    if (found) {
      cv::Mat gray;
      cv::cvtColor(image, gray, cv::COLOR_BGR2GRAY);
    
      cv::cornerSubPix(
	gray,
	image_points,
	cv::Size(11,11),
	cv::Size(-1,-1),
	cv::TermCriteria(cv::TermCriteria::EPS + cv::TermCriteria::COUNT, 30, 0.1)
      );
      
      // image_list_detected.push_back(image_list[i]);
      // object_points_list.push_back(object_points);
      // image_points_list.push_back(image_points);
      
      if (draw_corners)
	cv::drawChessboardCorners(image, board_size, cv::Mat(image_points), found);
    }
    
    return found;
  }